

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall el::base::LogFormat::operator==(LogFormat *this,LogFormat *other)

{
  size_t sVar1;
  int iVar2;
  
  if (this->m_level != other->m_level) {
    return false;
  }
  sVar1 = (this->m_userFormat)._M_string_length;
  if ((((sVar1 == (other->m_userFormat)._M_string_length) &&
       ((((sVar1 == 0 ||
          (iVar2 = bcmp((this->m_userFormat)._M_dataplus._M_p,(other->m_userFormat)._M_dataplus._M_p
                        ,sVar1), iVar2 == 0)) &&
         (sVar1 = (this->m_format)._M_string_length, sVar1 == (other->m_format)._M_string_length))
        && ((sVar1 == 0 ||
            (iVar2 = bcmp((this->m_format)._M_dataplus._M_p,(other->m_format)._M_dataplus._M_p,sVar1
                         ), iVar2 == 0)))))) &&
      (sVar1 = (this->m_dateTimeFormat)._M_string_length,
      sVar1 == (other->m_dateTimeFormat)._M_string_length)) &&
     ((sVar1 == 0 ||
      (iVar2 = bcmp((this->m_dateTimeFormat)._M_dataplus._M_p,
                    (other->m_dateTimeFormat)._M_dataplus._M_p,sVar1), iVar2 == 0)))) {
    return this->m_flags == other->m_flags;
  }
  return false;
}

Assistant:

bool LogFormat::operator==(const LogFormat& other) {
  return m_level == other.m_level && m_userFormat == other.m_userFormat && m_format == other.m_format &&
         m_dateTimeFormat == other.m_dateTimeFormat && m_flags == other.m_flags;
}